

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

HelicsBool helicsMessageGetFlagOption(HelicsMessage message,int flag)

{
  uint uVar1;
  
  uVar1 = 0;
  if (message != (HelicsMessage)0x0) {
    if (*(short *)((long)message + 10) != 0xb3) {
      message = (HelicsMessage)0x0;
    }
    if ((uint)flag < 0x10 && message != (HelicsMessage)0x0) {
      uVar1 = (uint)((*(ushort *)((long)message + 8) >> (flag & 0x1fU) & 1) != 0);
    }
  }
  return uVar1;
}

Assistant:

HelicsBool helicsMessageGetFlagOption(HelicsMessage message, int flag)
{
    auto* mess = getMessageObj(message, nullptr);
    if (mess == nullptr) {
        return HELICS_FALSE;
    }
    // bits in a uint16
    if (flag >= static_cast<int>(sizeof(uint16_t) * 8) || flag < 0) {
        return HELICS_FALSE;
    }
    return (checkActionFlag(*mess, flag) ? HELICS_TRUE : HELICS_FALSE);
}